

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_record_field_validate(coda_type_record_field *field)

{
  coda_type_record_field *field_local;
  
  if (field == (coda_type_record_field *)0x0) {
    coda_set_error(-100,"field argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x48d);
    field_local._4_4_ = -1;
  }
  else if (field->type == (coda_type *)0x0) {
    coda_set_error(-400,"missing type for field definition");
    field_local._4_4_ = -1;
  }
  else {
    field_local._4_4_ = 0;
  }
  return field_local._4_4_;
}

Assistant:

int coda_type_record_field_validate(const coda_type_record_field *field)
{
    if (field == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (field->type == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "missing type for field definition");
        return -1;
    }
    return 0;
}